

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

const_iterator __thiscall
libcellml::Importer::ImporterImpl::findImportSource
          (ImporterImpl *this,ImportSourcePtr *importSource)

{
  shared_ptr<libcellml::ImportSource> *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  long lVar4;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  _Var5;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __it._M_current =
       (this->mImports).
       super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->mImports).
           super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar2 = (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar4 = (long)psVar1 - (long)__it._M_current >> 6;
  local_40 = peVar2;
  local_38 = this_00;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)&local_40,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_0022826d;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)&local_40,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0022826d;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)&local_40,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0022826d;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)&local_40,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0022826d;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)psVar1 - (long)__it._M_current >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = psVar1;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                                *)&local_40,__it), _Var5._M_current = __it._M_current, bVar3))
      goto LAB_0022826d;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_40,__it);
    _Var5._M_current = __it._M_current;
    if (bVar3) goto LAB_0022826d;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                        *)&local_40,__it);
  _Var5._M_current = psVar1;
  if (bVar3) {
    _Var5._M_current = __it._M_current;
  }
LAB_0022826d:
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (const_iterator)_Var5._M_current;
}

Assistant:

bool Importer::addModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        // If the key already exists in the library, do nothing.
        return false;
    }
    pFunc()->mLibrary.insert(std::make_pair(normalisedKey, model));
    return true;
}